

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O1

argParserAdvancedConfiguration * __thiscall
argvParser::addArg(argvParser *this,string *argvShort,string *argvLong,string *help,
                  function<int_(int,_char_**)> *callBack)

{
  pointer pcVar1;
  vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
  *this_00;
  iterator __position;
  vector<argParserAdvancedConfiguration::argument*,std::allocator<argParserAdvancedConfiguration::argument*>>
  *this_01;
  iterator __position_00;
  bool bVar2;
  argument *paVar3;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *pvVar4;
  argument *local_108;
  function<int_(int,_char_**)> *local_100;
  string *local_f8;
  string local_f0;
  _Any_data local_d0;
  code *local_c0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (argvShort->_M_dataplus)._M_p;
  local_100 = callBack;
  local_f8 = help;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + argvShort->_M_string_length);
  bVar2 = argParserAdvancedConfiguration::existArg
                    (&this->super_argParserAdvancedConfiguration,&local_50);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar1 = (argvLong->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + argvLong->_M_string_length);
    bVar2 = argParserAdvancedConfiguration::existArg
                      (&this->super_argParserAdvancedConfiguration,&local_b0);
    bVar2 = !bVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar2) {
    this_00 = (vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
               *)(this->super_argParserAdvancedConfiguration).newargconfig;
    if (*(long *)(this_00 + 8) == *(long *)this_00) {
      paVar3 = (argument *)operator_new(0x28);
      (paVar3->argShort)._M_dataplus._M_p = (pointer)0x0;
      (paVar3->argShort)._M_string_length = 0;
      (paVar3->argShort).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(paVar3->argShort).field_2 + 8) = 0;
      (paVar3->argLong)._M_dataplus._M_p = (pointer)0x0;
      (paVar3->argShort)._M_dataplus._M_p = (pointer)&(paVar3->argShort).field_2;
      (paVar3->argShort)._M_string_length = 0;
      (paVar3->argShort).field_2._M_local_buf[0] = '\0';
      pvVar4 = (vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                *)operator_new(0x18);
      (pvVar4->
      super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar4->
      super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar4->
      super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (paVar3->argLong)._M_dataplus._M_p = (pointer)pvVar4;
      __position._M_current = *(section ***)(this_00 + 8);
      local_108 = paVar3;
      if (__position._M_current == *(section ***)(this_00 + 0x10)) {
        std::
        vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
        ::_M_realloc_insert<argParserAdvancedConfiguration::section*>
                  (this_00,__position,(section **)&local_108);
      }
      else {
        *__position._M_current = (section *)paVar3;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
    }
    this_01 = (vector<argParserAdvancedConfiguration::argument*,std::allocator<argParserAdvancedConfiguration::argument*>>
               *)(((this->super_argParserAdvancedConfiguration).newargconfig)->
                 super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1]->arguments;
    paVar3 = (argument *)operator_new(0xf0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar1 = (argvShort->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + argvShort->_M_string_length);
    pcVar1 = (argvLong->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + argvLong->_M_string_length);
    pcVar1 = (local_f8->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + local_f8->_M_string_length);
    std::function<int_(int,_char_**)>::function((function<int_(int,_char_**)> *)&local_d0,local_100)
    ;
    argParserAdvancedConfiguration::argument::argument
              (paVar3,&local_f0,&local_70,&local_90,(function<int_(int,_char_**)> *)&local_d0);
    __position_00._M_current = *(argument ***)(this_01 + 8);
    local_108 = paVar3;
    if (__position_00._M_current == *(argument ***)(this_01 + 0x10)) {
      std::
      vector<argParserAdvancedConfiguration::argument*,std::allocator<argParserAdvancedConfiguration::argument*>>
      ::_M_realloc_insert<argParserAdvancedConfiguration::argument*>
                (this_01,__position_00,&local_108);
    }
    else {
      *__position_00._M_current = paVar3;
      *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    }
    if (local_c0 != (code *)0x0) {
      (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  else {
    this = (argvParser *)0x0;
  }
  return &this->super_argParserAdvancedConfiguration;
}

Assistant:

argParserAdvancedConfiguration *
argvParser::addArg(string argvShort, string argvLong, string help, function<int(int, char **)> callBack) {
    if (!existArg(argvShort) && !existArg(argvLong)) {
        if(newargconfig->size() == 0){ // no section defined jet
            newargconfig->push_back(new section());
        }
        newargconfig->back()->arguments->push_back(new argument(argvShort, argvLong, help, callBack));
        return this;
    }
    return nullptr;
}